

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O3

uint __thiscall
llvm::DWARFVerifier::verifyDieRanges(DWARFVerifier *this,DWARFDie *Die,DieRangeInfo *ParentRI)

{
  pointer *R;
  char *pcVar1;
  pointer pDVar2;
  bool bVar3;
  uint uVar4;
  DWARFAbbreviationDeclaration *pDVar5;
  raw_ostream *prVar6;
  address_range_iterator R_00;
  die_range_info_iterator dVar7;
  size_t __n;
  size_t __n_00;
  void *__buf;
  void *__buf_00;
  uint uVar8;
  undefined1 in_R8B;
  undefined1 auVar9 [8];
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  StringRef Str_05;
  DWARFDie DVar10;
  DWARFDie DVar11;
  DieRangeInfo local_118;
  undefined1 local_b8 [8];
  Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
  RangesOrError;
  DWARFDie Child;
  undefined1 local_70 [8];
  DWARFAddressRangesVector Ranges;
  DWARFAddressRange Range;
  
  uVar8 = 0;
  if ((Die->U != (DWARFUnit *)0x0) && (Die->Die != (DWARFDebugInfoEntry *)0x0)) {
    DWARFDie::getAddressRanges
              ((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
                *)local_b8,Die);
    auVar9 = local_b8;
    if ((RangesOrError.field_0.TStorage.buffer[0x10] & 1U) == 0) {
      std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::vector
                ((vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_> *)
                 local_70,(vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                           *)local_b8);
      local_118.Die.U = Die->U;
      local_118.Die.Die = Die->Die;
      local_118.Children._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_118.Children._M_t._M_impl.super__Rb_tree_header._M_header;
      local_118.Ranges.
      super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_118.Ranges.
      super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>._M_impl.
      super__Vector_impl_data._M_finish = (DWARFAddressRange *)0x0;
      uVar8 = 0;
      local_118.Ranges.
      super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_118.Children._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_118.Children._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_118.Children._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_118.Children._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           local_118.Children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      if (((((this->IsObjectFile != true) || (this->IsMachOObject != false)) ||
           (pDVar5 = DWARFDie::getAbbreviationDeclarationPtr(Die),
           pDVar5 == (DWARFAbbreviationDeclaration *)0x0)) || (pDVar5->Tag != DW_TAG_compile_unit))
         && (pDVar2 = Ranges.
                      super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                      ._M_impl.super__Vector_impl_data._M_start,
            local_70 !=
            (undefined1  [8])
            Ranges.
            super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
            _M_impl.super__Vector_impl_data._M_start)) {
        uVar8 = 0;
        R = &Ranges.
             super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        auVar9 = local_70;
        do {
          Ranges.
          super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((pointer)auVar9)->LowPC;
          unique0x1000069b = (DWARFDebugInfoEntry *)((pointer)auVar9)->HighPC;
          if ((DWARFUnit *)((pointer)auVar9)->HighPC < (DWARFUnit *)((pointer)auVar9)->LowPC) {
            prVar6 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbd4a1c,
                                      (StringRef)ZEXT816(0),(bool)in_R8B);
            Str.Length = 0x16;
            Str.Data = "Invalid address range ";
            prVar6 = raw_ostream::operator<<(prVar6,Str);
            prVar6 = llvm::operator<<(prVar6,(DWARFAddressRange *)R);
            Str_00.Length = 1;
            Str_00.Data = "\n";
            raw_ostream::operator<<(prVar6,Str_00);
            uVar8 = uVar8 + 1;
          }
          else {
            R_00 = DieRangeInfo::insert(&local_118,(DWARFAddressRange *)R);
            if (R_00._M_current !=
                local_118.Ranges.
                super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              prVar6 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbd4a1c,
                                        (StringRef)ZEXT816(0),(bool)in_R8B);
              Str_01.Length = 0x24;
              Str_01.Data = "DIE has overlapping address ranges: ";
              prVar6 = raw_ostream::operator<<(prVar6,Str_01);
              prVar6 = llvm::operator<<(prVar6,(DWARFAddressRange *)
                                               &Ranges.
                                                super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
              Str_02.Length = 5;
              Str_02.Data = " and ";
              prVar6 = raw_ostream::operator<<(prVar6,Str_02);
              prVar6 = llvm::operator<<(prVar6,R_00._M_current);
              Str_03.Length = 1;
              Str_03.Data = "\n";
              raw_ostream::operator<<(prVar6,Str_03);
              uVar8 = uVar8 + 1;
              break;
            }
          }
          auVar9 = (undefined1  [8])((long)auVar9 + 0x18);
        } while (auVar9 != (undefined1  [8])pDVar2);
      }
      dVar7 = DieRangeInfo::insert(ParentRI,&local_118);
      if ((_Rb_tree_header *)dVar7._M_node !=
          &(ParentRI->Children)._M_t._M_impl.super__Rb_tree_header) {
        prVar6 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbd4a1c,
                                  (StringRef)ZEXT816(0),(bool)in_R8B);
        Str_04.Length = 0x25;
        Str_04.Data = "DIEs have overlapping address ranges:";
        raw_ostream::operator<<(prVar6,Str_04);
        DWARFDie::dump(Die,this->OS,0,this->DumpOpts);
        __n._0_1_ = (this->DumpOpts).ShowChildren;
        __n._1_1_ = (this->DumpOpts).ShowParents;
        __n._2_1_ = (this->DumpOpts).ShowForm;
        __n._3_1_ = (this->DumpOpts).SummarizeTypes;
        __n._4_1_ = (this->DumpOpts).Verbose;
        __n._5_1_ = (this->DumpOpts).DisplayRawContents;
        __n._6_2_ = *(undefined2 *)&(this->DumpOpts).field_0x16;
        DWARFDie::dump((DWARFDie *)(dVar7._M_node + 1),this->OS,0,this->DumpOpts);
        uVar8 = uVar8 + 1;
        prVar6 = this->OS;
        pcVar1 = prVar6->OutBufCur;
        if (pcVar1 < prVar6->OutBufEnd) {
          prVar6->OutBufCur = pcVar1 + 1;
          *pcVar1 = '\n';
        }
        else {
          raw_ostream::write(prVar6,10,__buf,__n);
        }
      }
      if ((((local_70 !=
             (undefined1  [8])
             Ranges.
             super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
             _M_impl.super__Vector_impl_data._M_start) &&
           ((ParentRI->Ranges).
            super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            (ParentRI->Ranges).
            super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
            _M_impl.super__Vector_impl_data._M_finish)) &&
          (((pDVar5 = DWARFDie::getAbbreviationDeclarationPtr(Die),
            pDVar5 == (DWARFAbbreviationDeclaration *)0x0 ||
            ((pDVar5->Tag != DW_TAG_subprogram ||
             (pDVar5 = DWARFDie::getAbbreviationDeclarationPtr(&ParentRI->Die),
             pDVar5 == (DWARFAbbreviationDeclaration *)0x0)))) || (pDVar5->Tag != DW_TAG_subprogram)
           ))) && (bVar3 = DieRangeInfo::contains(ParentRI,&local_118), !bVar3)) {
        prVar6 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xbd4a1c,
                                  (StringRef)ZEXT816(0),(bool)in_R8B);
        Str_05.Length = 0x3c;
        Str_05.Data = "DIE address ranges are not contained in its parent\'s ranges:";
        raw_ostream::operator<<(prVar6,Str_05);
        DWARFDie::dump(&ParentRI->Die,this->OS,0,this->DumpOpts);
        __n_00._0_1_ = (this->DumpOpts).ShowChildren;
        __n_00._1_1_ = (this->DumpOpts).ShowParents;
        __n_00._2_1_ = (this->DumpOpts).ShowForm;
        __n_00._3_1_ = (this->DumpOpts).SummarizeTypes;
        __n_00._4_1_ = (this->DumpOpts).Verbose;
        __n_00._5_1_ = (this->DumpOpts).DisplayRawContents;
        __n_00._6_2_ = *(undefined2 *)&(this->DumpOpts).field_0x16;
        DWARFDie::dump(Die,this->OS,2,this->DumpOpts);
        uVar8 = uVar8 + 1;
        prVar6 = this->OS;
        pcVar1 = prVar6->OutBufCur;
        if (pcVar1 < prVar6->OutBufEnd) {
          prVar6->OutBufCur = pcVar1 + 1;
          *pcVar1 = '\n';
        }
        else {
          raw_ostream::write(prVar6,10,__buf_00,__n_00);
        }
      }
      DVar10 = DWARFDie::getFirstChild(Die);
      unique0x10000c89 = DVar10;
      DVar11 = DWARFDie::getLastChild(Die);
      if (SUB168((undefined1  [16])DVar10 ^ (undefined1  [16])DVar11,0) != 0 ||
          SUB168((undefined1  [16])DVar10 ^ (undefined1  [16])DVar11,8) != 0) {
        do {
          RangesOrError._24_8_ =
               Ranges.
               super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          uVar4 = verifyDieRanges(this,(DWARFDie *)&RangesOrError.field_0x18,&local_118);
          join_0x00000010_0x00000000_ =
               DWARFDie::getSibling
                         ((DWARFDie *)
                          &Ranges.
                           super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
          uVar8 = uVar8 + uVar4;
        } while (SUB168((undefined1  [16])DVar11 ^ (undefined1  [16])join_0x00000010_0x00000000_,0)
                 != 0 || SUB168((undefined1  [16])DVar11 ^
                                (undefined1  [16])join_0x00000010_0x00000000_,8) != 0);
      }
      std::
      _Rb_tree<llvm::DWARFVerifier::DieRangeInfo,_llvm::DWARFVerifier::DieRangeInfo,_std::_Identity<llvm::DWARFVerifier::DieRangeInfo>,_std::less<llvm::DWARFVerifier::DieRangeInfo>,_std::allocator<llvm::DWARFVerifier::DieRangeInfo>_>
      ::~_Rb_tree(&local_118.Children._M_t);
      if (local_118.Ranges.
          super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.Ranges.
                        super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_118.Ranges.
                              super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.Ranges.
                              super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_70 != (undefined1  [8])0x0) {
        operator_delete((void *)local_70,
                        (long)Ranges.
                              super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)local_70);
      }
    }
    else {
      local_b8[0] = '\0';
      local_b8[1] = '\0';
      local_b8[2] = '\0';
      local_b8[3] = '\0';
      local_b8[4] = '\0';
      local_b8[5] = '\0';
      local_b8[6] = '\0';
      local_b8[7] = '\0';
      local_118.Die.U = (DWARFUnit *)((ulong)auVar9 | 1);
      handleAllErrors<llvm::consumeError(llvm::Error)::_lambda(llvm::ErrorInfoBase_const&)_1_>
                ((Error *)&local_118,(anon_class_1_0_00000001 *)local_70);
      if ((long *)((ulong)local_118.Die.U & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)local_118.Die.U & 0xfffffffffffffffe) + 8))();
      }
      uVar8 = 1;
    }
    Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>::
    ~Expected((Expected<std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>_>
               *)local_b8);
  }
  return uVar8;
}

Assistant:

unsigned DWARFVerifier::verifyDieRanges(const DWARFDie &Die,
                                        DieRangeInfo &ParentRI) {
  unsigned NumErrors = 0;

  if (!Die.isValid())
    return NumErrors;

  auto RangesOrError = Die.getAddressRanges();
  if (!RangesOrError) {
    // FIXME: Report the error.
    ++NumErrors;
    llvm::consumeError(RangesOrError.takeError());
    return NumErrors;
  }

  DWARFAddressRangesVector Ranges = RangesOrError.get();
  // Build RI for this DIE and check that ranges within this DIE do not
  // overlap.
  DieRangeInfo RI(Die);

  // TODO support object files better
  //
  // Some object file formats (i.e. non-MachO) support COMDAT.  ELF in
  // particular does so by placing each function into a section.  The DWARF data
  // for the function at that point uses a section relative DW_FORM_addrp for
  // the DW_AT_low_pc and a DW_FORM_data4 for the offset as the DW_AT_high_pc.
  // In such a case, when the Die is the CU, the ranges will overlap, and we
  // will flag valid conflicting ranges as invalid.
  //
  // For such targets, we should read the ranges from the CU and partition them
  // by the section id.  The ranges within a particular section should be
  // disjoint, although the ranges across sections may overlap.  We would map
  // the child die to the entity that it references and the section with which
  // it is associated.  The child would then be checked against the range
  // information for the associated section.
  //
  // For now, simply elide the range verification for the CU DIEs if we are
  // processing an object file.

  if (!IsObjectFile || IsMachOObject || Die.getTag() != DW_TAG_compile_unit) {
    for (auto Range : Ranges) {
      if (!Range.valid()) {
        ++NumErrors;
        error() << "Invalid address range " << Range << "\n";
        continue;
      }

      // Verify that ranges don't intersect.
      const auto IntersectingRange = RI.insert(Range);
      if (IntersectingRange != RI.Ranges.end()) {
        ++NumErrors;
        error() << "DIE has overlapping address ranges: " << Range << " and "
                << *IntersectingRange << "\n";
        break;
      }
    }
  }

  // Verify that children don't intersect.
  const auto IntersectingChild = ParentRI.insert(RI);
  if (IntersectingChild != ParentRI.Children.end()) {
    ++NumErrors;
    error() << "DIEs have overlapping address ranges:";
    dump(Die);
    dump(IntersectingChild->Die) << '\n';
  }

  // Verify that ranges are contained within their parent.
  bool ShouldBeContained = !Ranges.empty() && !ParentRI.Ranges.empty() &&
                           !(Die.getTag() == DW_TAG_subprogram &&
                             ParentRI.Die.getTag() == DW_TAG_subprogram);
  if (ShouldBeContained && !ParentRI.contains(RI)) {
    ++NumErrors;
    error() << "DIE address ranges are not contained in its parent's ranges:";
    dump(ParentRI.Die);
    dump(Die, 2) << '\n';
  }

  // Recursively check children.
  for (DWARFDie Child : Die)
    NumErrors += verifyDieRanges(Child, RI);

  return NumErrors;
}